

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall SmallArray<unsigned_char,_8U>::~SmallArray(SmallArray<unsigned_char,_8U> *this)

{
  SmallArray<unsigned_char,_8U> *this_local;
  
  if (this->data != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      NULLC::destruct<unsigned_char>(this->data,(ulong)this->max);
    }
    else {
      Allocator::destruct<unsigned_char>(this->allocator,this->data,(ulong)this->max);
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}